

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O2

ValueLength arangodb::velocypack::readVariableValueLength<false>(uint8_t *source)

{
  byte bVar1;
  ValueLength VVar2;
  byte bVar3;
  uint8_t v;
  
  VVar2 = 0;
  bVar3 = 0;
  do {
    bVar1 = *source;
    VVar2 = VVar2 + ((ulong)(bVar1 & 0x7f) << (bVar3 & 0x3f));
    bVar3 = bVar3 + 7;
    source = source + 1;
  } while ((char)bVar1 < '\0');
  return VVar2;
}

Assistant:

static inline ValueLength readVariableValueLength(
    uint8_t const* source) noexcept {
  ValueLength len = 0;
  uint8_t v;
  ValueLength p = 0;
  do {
    v = *source;
    len += static_cast<ValueLength>(v & 0x7fU) << p;
    p += 7;
    if (reverse) {
      --source;
    } else {
      ++source;
    }
  } while (v & 0x80U);
  return len;
}